

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O3

vertex_iterator __thiscall
xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::
ObtainVertexFromVertexMap
          (Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
           *this,StateExample *state)

{
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
  _Var1;
  VertexMapType *this_00;
  int64_t state_id;
  int64_t local_30;
  int64_t local_28;
  undefined8 *local_20;
  
  local_30 = state->id;
  this_00 = &this->vertex_map_;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<long,_std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_30);
  if (_Var1._M_cur == (__node_type *)0x0) {
    local_20 = (undefined8 *)operator_new(0x70);
    *local_20 = state;
    local_20[1] = local_30;
    local_20[4] = local_20 + 3;
    local_20[3] = local_20 + 3;
    local_20[5] = 0;
    local_20[7] = local_20 + 6;
    local_20[6] = local_20 + 6;
    local_20[8] = 0;
    *(undefined1 *)(local_20 + 9) = 0;
    *(undefined1 *)((long)local_20 + 0x49) = 0;
    *(undefined4 *)(local_20 + 10) = 0xffffffff;
    *(undefined4 *)((long)local_20 + 0x54) = 0x7fefffff;
    *(undefined4 *)(local_20 + 0xb) = 0xffffffff;
    *(undefined4 *)((long)local_20 + 0x5c) = 0x7fefffff;
    local_20[0xc] = 0x7fefffffffffffff;
    local_20[0xd] = 0;
    local_28 = local_30;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<long,_std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,&local_30);
  }
  return (vertex_iterator)_Var1._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}